

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

RegOpnd * __thiscall IR::Opnd::FindRegUse(Opnd *this,RegOpnd *regOpnd)

{
  StackSym *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RegOpnd *pRVar5;
  IndirOpnd *indirOpnd;
  
  pSVar1 = regOpnd->m_sym;
  if (this->m_kind == OpndKindIndir) {
    pRVar5 = (RegOpnd *)this[1]._vptr_Opnd;
    if ((pRVar5 == (RegOpnd *)0x0) || (pRVar5->m_sym != pSVar1)) {
      pRVar5 = *(RegOpnd **)&this[1].m_valueType;
      if (pRVar5 == (RegOpnd *)0x0) {
        bVar3 = true;
      }
      else {
        bVar3 = pRVar5->m_sym != pSVar1;
      }
    }
    else {
      bVar3 = false;
    }
    if (!bVar3) {
      return pRVar5;
    }
  }
  else if ((this->m_kind == OpndKindReg) && ((StackSym *)this[1]._vptr_Opnd == pSVar1)) {
    if (this->m_kind == OpndKindReg) {
      return (RegOpnd *)this;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (bVar3) {
      *puVar4 = 0;
      return (RegOpnd *)this;
    }
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  return (RegOpnd *)0x0;
}

Assistant:

IR::RegOpnd *
Opnd::FindRegUse(IR::RegOpnd *regOpnd)
{
    StackSym *regSym = regOpnd->m_sym;

    if (this->IsRegOpnd())
    {
        if (this->AsRegOpnd()->m_sym == regSym)
        {
            return this->AsRegOpnd();
        }
    }
    else if (this->IsIndirOpnd())
    {
        IndirOpnd *indirOpnd = this->AsIndirOpnd();
        if (indirOpnd->GetBaseOpnd() && indirOpnd->GetBaseOpnd()->m_sym == regSym)
        {
            return indirOpnd->GetBaseOpnd();
        }
        if (indirOpnd->GetIndexOpnd() && indirOpnd->GetIndexOpnd()->m_sym == regSym)
        {
            return indirOpnd->GetIndexOpnd();
        }
    }

    return nullptr;
}